

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute_mst.c
# Opt level: O0

Tree flute_mr(int d,int *xs,int *ys,int *s,int acc,int rounds,int **dist,int *threshold_x,
             int *threshold_y,int *threshold,int *best_round,int *min_node1,int *min_node2,int **nb)

{
  undefined4 uVar1;
  undefined4 uVar3;
  Branch *__ptr;
  dl_el_s *pdVar2;
  dl_t paVar4;
  long lVar5;
  Tree *__ptr_00;
  Tree *pTVar6;
  int iVar7;
  int iVar8;
  Tree TVar9;
  int iStack_3ec6c;
  int iStack_3ec64;
  dl_t _curr_dl;
  dl_el *_next;
  dl_el *_el;
  Branch *pBStack_3ec40;
  undefined8 uStack_3ec38;
  Branch *pBStack_3ec30;
  int aiStack_3ec28 [2];
  int xmap [1000];
  int si [500];
  int new_s [1000];
  int y [1000];
  int x [1000];
  int order_base [55000];
  int *order [110];
  int offset [500];
  int idx [500];
  int edges [1000];
  int tree_size [500];
  int local_1fe8;
  int tid;
  int tree_id [500];
  int isSuperRoot [500];
  int suproot [500];
  int subroot [500];
  int num_subtree;
  int max_x;
  int min_x;
  Tree ttmp;
  Tree *subtree;
  Tree t;
  int dist2;
  int dist1;
  int longest;
  int min_dist;
  int node2;
  int node1;
  int itr;
  int n;
  int m;
  int k;
  int j;
  int i;
  int rounds_local;
  int acc_local;
  int *s_local;
  int *ys_local;
  int *xs_local;
  undefined4 uStack_18;
  int d_local;
  Tree best_t;
  
  for (k = 0; k <= d; k = k + 1) {
    paVar4 = dl_alloc();
    ht[k] = paVar4;
  }
  best_t.deg = 0;
  best_t.length = 0;
  d_local = 0x7fffffff;
  for (k = 0; j = rounds, k < 0x6e; k = k + 1) {
    order[(long)k + -1] = x + (long)(k * d) + 0x3e6;
  }
  do {
    if (j < 0) {
LAB_001593f8:
      for (k = 0; k <= d; k = k + 1) {
        _next = ht[k]->first;
        while (_next != (dl_el *)0x0) {
          pdVar2 = _next->next;
          free(_next[1].next);
          _next = pdVar2;
        }
        dl_clear(ht[k]);
        free(ht[k]);
        ht[k] = (dl_t)0x0;
      }
      TVar9.length = d_local;
      TVar9.deg = uStack_18;
      TVar9.branch = (Branch *)best_t._0_8_;
      return TVar9;
    }
    for (k = 0; k < d; k = k + 1) {
      y[(long)k + 0x3e6] = xs[s[k]];
      new_s[(long)k + 0x3e6] = ys[k];
      tree_id[(long)k + 0x1f2] = 0;
    }
    if (j == FIRST_ROUND) {
      build_rmst((long)d,y + 0x3e6,new_s + 0x3e6,idx + 0x1f2,&local_1fe8);
      for (k = 0; k < d; k = k + 1) {
        dist[k][k] = 0;
      }
    }
    else {
      mst_from_heap(d,dist,*min_node1,*min_node2,nb,idx + 0x1f2,&local_1fe8);
    }
    if (j != 0) {
      dist2 = 0;
      for (k = 0; k < d; k = k + 1) {
        nb[k][1] = 2;
      }
    }
    k = 0;
    while (k < d * 2 + -2) {
      iVar7 = k + 1;
      iVar8 = idx[(long)k + 0x1f2];
      k = k + 2;
      iVar7 = idx[(long)iVar7 + 0x1f2];
      if (j != 0) {
        enqueue(nb + iVar8,iVar7);
        enqueue(nb + iVar7,iVar8);
        if (y[(long)iVar7 + 0x3e6] < y[(long)iVar8 + 0x3e6]) {
          iStack_3ec64 = y[(long)iVar8 + 0x3e6] - y[(long)iVar7 + 0x3e6];
        }
        else {
          iStack_3ec64 = y[(long)iVar7 + 0x3e6] - y[(long)iVar8 + 0x3e6];
        }
        if (new_s[(long)iVar7 + 0x3e6] < new_s[(long)iVar8 + 0x3e6]) {
          iStack_3ec6c = new_s[(long)iVar8 + 0x3e6] - new_s[(long)iVar7 + 0x3e6];
        }
        else {
          iStack_3ec6c = new_s[(long)iVar7 + 0x3e6] - new_s[(long)iVar8 + 0x3e6];
        }
        dist[iVar7][iVar8] = iStack_3ec64 + iStack_3ec6c;
        dist[iVar8][iVar7] = iStack_3ec64 + iStack_3ec6c;
        if (dist2 < dist[iVar8][iVar7]) {
          dist2 = dist[iVar8][iVar7];
        }
      }
    }
    for (k = 0; k < d; k = k + 1) {
      edges[(long)k + 0x3e6] = 1;
    }
    suproot[0x1f2] = idx[0x1f2];
    isSuperRoot[0x1f2] = idx[0x1f2];
    subroot[499] = 1;
    k = d * 2 + -3;
    while (-1 < k) {
      iVar7 = k + -1;
      iVar8 = idx[(long)k + 0x1f2];
      k = k + -2;
      iVar7 = idx[(long)iVar7 + 0x1f2];
      if ((double)(edges[(long)iVar7 + 0x3e6] + edges[(long)iVar8 + 0x3e6]) <
          (double)acc * 1.3 + 8.0) {
        edges[(long)iVar7 + 0x3e6] = edges[(long)iVar7 + 0x3e6] + edges[(long)iVar8 + 0x3e6];
      }
      else {
        tree_id[(long)iVar7 + 0x1f2] = 1;
        isSuperRoot[(long)subroot[499] + 0x1f2] = iVar7;
        suproot[(long)subroot[499] + 0x1f2] = iVar8;
        subroot[499] = subroot[499] + 1;
      }
    }
    for (k = 1; k < subroot[499]; k = k + 1) {
      (&local_1fe8)[suproot[(long)k + 0x1f2]] = k + 1;
      edges[(long)suproot[(long)k + 0x1f2] + 0x3e6] =
           edges[(long)suproot[(long)k + 0x1f2] + 0x3e6] + 1;
    }
    k = 0;
    while (k < d * 2 + -2) {
      iVar8 = k + 1;
      lVar5 = (long)k;
      k = k + 2;
      if ((&local_1fe8)[idx[(long)iVar8 + 0x1f2]] == 1) {
        (&local_1fe8)[idx[(long)iVar8 + 0x1f2]] = (&local_1fe8)[idx[lVar5 + 0x1f2]];
      }
    }
    for (k = 0; k < d; k = k + 1) {
      xmap[(long)s[k] + 0x3e6] = k;
    }
    order[0x6d]._4_4_ = 0;
    for (k = 1; k < subroot[499]; k = k + 1) {
      offset[(long)(k + 1) + -2] =
           offset[(long)k + -2] + edges[(long)suproot[(long)(k + -1) + 0x1f2] + 0x3e6];
    }
    for (k = 0; k <= subroot[499]; k = k + 1) {
      offset[(long)k + 0x1f2] = 0;
    }
    for (k = 0; k < d; k = k + 1) {
      iVar8 = (&local_1fe8)[xmap[(long)k + 0x3e6]];
      iVar7 = offset[(long)iVar8 + 0x1f2];
      offset[(long)iVar8 + 0x1f2] = iVar7 + 1;
      y[(long)(offset[(long)iVar8 + -2] + iVar7) + 0x3e6] = xs[k];
      aiStack_3ec28[k] = iVar7;
      if (tree_id[(long)xmap[(long)k + 0x3e6] + 0x1f2] != 0) {
        for (n = 1; n < subroot[499]; n = n + 1) {
          if (isSuperRoot[(long)n + 0x1f2] == xmap[(long)k + 0x3e6]) {
            iVar7 = n + 1;
            iVar8 = offset[(long)iVar7 + 0x1f2];
            offset[(long)iVar7 + 0x1f2] = iVar8 + 1;
            y[(long)(offset[(long)iVar7 + -2] + iVar8) + 0x3e6] = xs[k];
            aiStack_3ec28[d + -1 + iVar7] = iVar8;
          }
        }
      }
    }
    for (k = 0; k <= subroot[499]; k = k + 1) {
      offset[(long)k + 0x1f2] = 0;
    }
    for (k = 0; k < d; k = k + 1) {
      iVar8 = (&local_1fe8)[k];
      iVar7 = offset[(long)iVar8 + 0x1f2];
      offset[(long)iVar8 + 0x1f2] = iVar7 + 1;
      new_s[(long)(offset[(long)iVar8 + -2] + iVar7) + 0x3e6] = ys[k];
      si[(long)(offset[(long)iVar8 + -2] + iVar7) + 0x1f2] = aiStack_3ec28[s[k]];
      order[(long)(iVar8 + -1) + -1][iVar7] = k;
      if (tree_id[(long)k + 0x1f2] != 0) {
        for (n = 1; n < subroot[499]; n = n + 1) {
          if (isSuperRoot[(long)n + 0x1f2] == k) {
            iVar7 = n + 1;
            iVar8 = offset[(long)iVar7 + 0x1f2];
            offset[(long)iVar7 + 0x1f2] = iVar8 + 1;
            new_s[(long)(offset[(long)iVar7 + -2] + iVar8) + 0x3e6] = ys[k];
            si[(long)(offset[(long)iVar7 + -2] + iVar8) + 0x1f2] = aiStack_3ec28[d + -1 + iVar7];
            order[(long)n + -1][iVar8] = k;
          }
        }
      }
    }
    __ptr_00 = (Tree *)malloc((long)subroot[499] << 4);
    for (k = 1; k <= subroot[499]; k = k + 1) {
      if (edges[(long)suproot[(long)(k + -1) + 0x1f2] + 0x3e6] < 2) {
        __ptr_00[k + -1].deg = 0;
      }
      else {
        TVar9 = flutes_c(edges[(long)suproot[(long)(k + -1) + 0x1f2] + 0x3e6],
                         y + (long)offset[(long)k + -2] + 0x3e6,
                         new_s + (long)offset[(long)k + -2] + 0x3e6,
                         si + (long)offset[(long)k + -2] + 0x1f2,acc);
        uStack_3ec38 = TVar9._0_8_;
        pBStack_3ec30 = TVar9.branch;
        pTVar6 = __ptr_00 + (k + -1);
        pTVar6->deg = (undefined4)uStack_3ec38;
        pTVar6->length = uStack_3ec38._4_4_;
        pTVar6->branch = pBStack_3ec30;
      }
    }
    for (k = 1; k < subroot[499]; k = k + 1) {
      TVar9 = wmergetree(__ptr_00[(&local_1fe8)[isSuperRoot[(long)k + 0x1f2]] + -1],
                         __ptr_00[(&local_1fe8)[suproot[(long)k + 0x1f2]] + -1],
                         order[(long)((&local_1fe8)[isSuperRoot[(long)k + 0x1f2]] + -1) + -1],
                         order[(long)((&local_1fe8)[suproot[(long)k + 0x1f2]] + -1) + -1],
                         xs[s[isSuperRoot[(long)k + 0x1f2]]],ys[isSuperRoot[(long)k + 0x1f2]],acc);
      _el = TVar9._0_8_;
      pBStack_3ec40 = TVar9.branch;
      __ptr_00[(&local_1fe8)[suproot[(long)k + 0x1f2]] + -1].deg = 0;
      iVar8 = (&local_1fe8)[isSuperRoot[(long)k + 0x1f2]];
      *(dl_el **)(__ptr_00 + (iVar8 + -1)) = _el;
      __ptr_00[iVar8 + -1].branch = pBStack_3ec40;
    }
    uVar1 = __ptr_00->deg;
    uVar3 = __ptr_00->length;
    __ptr = __ptr_00->branch;
    TVar9 = *__ptr_00;
    free(__ptr_00);
    if (d_local < (int)uVar3) {
      if (EARLY_QUIT_CRITERIA <= *best_round - j) {
        if (__ptr != (Branch *)0x0) {
          free(__ptr);
        }
        goto LAB_001593f8;
      }
    }
    else if (d_local == uVar3) {
      *best_round = j;
    }
    else if ((int)uVar3 < d_local) {
      if (best_t._0_8_ != 0) {
        free((void *)best_t._0_8_);
      }
      uStack_18 = uVar1;
      d_local = uVar3;
      *best_round = j;
      best_t._0_8_ = __ptr;
    }
    if (0 < j) {
      for (k = 0; k < d; k = k + 1) {
        y[(long)k + 0x3e6] = xs[s[k]];
        new_s[(long)k + 0x3e6] = ys[k];
      }
      *min_node1 = idx[0x1f2];
      *min_node2 = idx[499];
      update_dist2(TVar9,dist,dist2,idx + 0x1f2,min_node1,min_node2,nb);
    }
    if ((__ptr != (Branch *)0x0) && ((Branch *)best_t._0_8_ != __ptr)) {
      free(__ptr);
    }
    j = j + -1;
  } while( true );
}

Assistant:

Tree flute_mr(int d, DTYPE *xs, DTYPE *ys, int *s,
	      int acc, int rounds, DTYPE **dist,
	      DTYPE *threshold_x, DTYPE *threshold_y,
	      DTYPE *threshold, 
	      int *best_round,
	      int *min_node1, int *min_node2,
	      int **nb)
{
  int i, j, k, m, n, itr, node1, node2;
  DTYPE min_dist, longest;
  DTYPE dist1, dist2;
  Tree t, best_t, *subtree, ttmp;
  DTYPE min_x, max_x;

#if MR_FOR_SMALL_CASES_ONLY
  int num_subtree, subroot[MAXPART], suproot[MAXPART], isSuperRoot[D2M];
  int tree_id[D2M], tid, tree_size[D2M], edges[2*D2M];
  int idx[MAXPART], offset[MAXPART], *order[MAXT], order_base[MAXT*D2M];
  DTYPE x[D2M+MAXPART], y[D2M+MAXPART];
  int new_s[D2M+MAXPART], si[D2M], xmap[D2M+MAXPART];
#else
  int num_subtree, *subroot, *suproot, *isSuperRoot;
  int *tree_id, tid, *tree_size, *edges;
  int *idx, *offset, **order, *order_base;
  DTYPE *x, *y;
  int *new_s, *si, *xmap;

  subroot = (int*)malloc(sizeof(int)*MAXPART);
  suproot = (int*)malloc(sizeof(int)*MAXPART);
  idx = (int*)malloc(sizeof(int)*MAXPART);
  offset = (int*)malloc(sizeof(int)*MAXPART);
  order = (int**)malloc(sizeof(int*)*MAXT);

  isSuperRoot = (int*)malloc(sizeof(int)*d);
  tree_id = (int*)malloc(sizeof(int)*d);
  tree_size = (int*)malloc(sizeof(int)*d);
  edges = (int*)malloc(sizeof(int)*d*2);
  order_base = (int*)malloc(sizeof(int)*d*MAXT);
  new_s = (int*)malloc(sizeof(int)*(d+MAXPART));
  si = (int*)malloc(sizeof(int)*d);
  xmap = (int*)malloc(sizeof(int)*(d+MAXPART));
  x = (DTYPE*)malloc(sizeof(DTYPE)*(d+MAXPART));
  y = (DTYPE*)malloc(sizeof(DTYPE)*(d+MAXPART));
#endif

#if USE_HASHING
  if (new_ht) {
    for (i=0; i<=d; i++) {
      ht[i] = dl_alloc();
    }
  }
#endif

  best_t.branch = NULL;
  best_t.length = INFNTY;

  for (i=0; i<MAXT; i++) {
    //order[i] = &(order_base[i*D2(acc)]);
    order[i] = &(order_base[i*d]);
  }

  while (rounds>=0) {
    for (i=0; i<d; i++) {
      x[i] = xs[s[i]];
      y[i] = ys[i];
      isSuperRoot[i] = 0;
    }

    if (rounds==FIRST_ROUND) {
      build_rmst((long)d, x, y, edges, tree_id);
      for (i=0; i<d; i++) dist[i][i]=0;
    } else {
      mst_from_heap(d, dist, *min_node1, *min_node2, nb, edges, tree_id);
    }

    if (rounds!=0) {
      longest = 0;
      for (i=0; i<d; i++) {
	init_queue(nb[i]);
      }
    }

    for (i=0; i<2*d-2; ) {
      node1 = edges[i++];
      node2 = edges[i++];
      if (rounds!=0) {
	enqueue(&nb[node1], node2);
	enqueue(&nb[node2], node1);
	dist[node1][node2] = dist[node2][node1] =
	  ADIFF(x[node1], x[node2]) + ADIFF(y[node1], y[node2]);
	if (longest < dist[node1][node2]) {
	  longest = dist[node1][node2];
	}
      }
    }

    for (i=0; i<d; i++) {
      tree_size[i] = 1;  // the node itself
    }

    suproot[0] = subroot[0] = edges[0];
    num_subtree=1;

    for (i=2*d-3; i>=0; ) {
      node2 = edges[i--];
      node1 = edges[i--];
      j = tree_size[node1]+tree_size[node2];
      //Chris
      if (j >= TAU(acc)) {
	isSuperRoot[node1] = 1;
	suproot[num_subtree] = node1;
	subroot[num_subtree++] = node2;
      } else {
	tree_size[node1] = j;
      }
    }

    //assert(num_subtree<=MAXT);

    for (i=1; i<num_subtree; i++) {
      tree_id[subroot[i]] = i+1;
      tree_size[subroot[i]] += 1;  // to account for the link to parent tree
    }

    for (i=0; i<2*d-2; ) {
      node1 = edges[i++];
      node2 = edges[i++];
      if (tree_id[node2]==1) { // non-root node
	tree_id[node2] = tree_id[node1];
      }
    }

    // Find inverse si[] of s[]
    for (i=0; i<d; i++)
      si[s[i]] = i;

    offset[1] = 0;
    for (i=1; i<num_subtree; i++) {
      offset[i+1] = offset[i] + tree_size[subroot[i-1]];
    }
    //assert(offset[num_subtree]==d+num_subtree-1-tree_size[subroot[num_subtree-1]]);

    for (i=0; i<=num_subtree; i++)
      idx[i] = 0;

    for (i=0; i<d; i++) {
      tid = tree_id[si[i]];
      j = idx[tid]++;
      x[offset[tid]+j] = xs[i];
      xmap[i] = j;

      if (isSuperRoot[si[i]]) {
	for (k=1; k<num_subtree; k++) {
	  if (suproot[k]==si[i]) {
	    tid = k+1;
	    j = idx[tid]++;
	    x[offset[tid]+j] = xs[i];
	    xmap[d-1+tid] = j;
	  }
	}
      }
    }

    for (i=0; i<=num_subtree; i++)
      idx[i] = 0;

    for (i=0; i<d; i++) {
      tid = tree_id[i];
      j = idx[tid]++;
      y[offset[tid]+j] = ys[i];
      new_s[offset[tid]+j] = xmap[s[i]];
      order[tid-1][j] = i;

      if (isSuperRoot[i]) {
	for (k=1; k<num_subtree; k++) {
	  if (suproot[k]==i) {
	    tid = k+1;
	    j = idx[tid]++;
	    y[offset[tid]+j] = ys[i];
	    new_s[offset[tid]+j] = xmap[d-1+tid];
	    order[tid-1][j] = i;
	  }
	}
      }
    }

    subtree = (Tree*)malloc(num_subtree*sizeof(Tree));
    for (i=1; i<=num_subtree; i++) {
      if (tree_size[subroot[i-1]] <= 1) {
	subtree[i-1].deg = 0;
	continue;
      }

      t = flutes_c(tree_size[subroot[i-1]], x+offset[i], y+offset[i],
		   new_s+offset[i], acc);
    
      subtree[i-1] = t;
    }


    for (i=1; i<num_subtree; i++) {
      //assert(tree_id[suproot[i]] != tree_id[subroot[i]]);

      t = wmergetree(subtree[tree_id[suproot[i]]-1],
		     subtree[tree_id[subroot[i]]-1],
		     order[tree_id[suproot[i]]-1],
		     order[tree_id[subroot[i]]-1],
		     xs[s[suproot[i]]], ys[suproot[i]], acc);

      subtree[tree_id[subroot[i]]-1].deg = 0;
      subtree[tree_id[suproot[i]]-1] = t;
    }

    t = subtree[0];
    free(subtree);
  
    if (best_t.length < t.length) {
      if (*best_round-rounds >= EARLY_QUIT_CRITERIA) {
	if (t.branch) {
	  free(t.branch);
	}
	break;
      }
    } else if (best_t.length == t.length) {
      *best_round = rounds;
    } else if (best_t.length > t.length) {
      if (best_t.branch) {
	free(best_t.branch);
      }
      best_t = t;
      *best_round = rounds;
    }

    if (rounds > 0) {
      for (i=0; i<d; i++) {
	x[i] = xs[s[i]];
	y[i] = ys[i];
      }

      *min_node1 = edges[0];
      *min_node2 = edges[1];

      update_dist2(t, dist, longest, edges, min_node1, min_node2, nb);
    }

    if (t.branch != 0 && best_t.branch != t.branch) {
      free(t.branch);
    }

    rounds--;
  }
  
#if !(MR_FOR_SMALL_CASES_ONLY)
  free(subroot); free(suproot); free(idx); free(offset); free(order);
  free(isSuperRoot); free(tree_id); free(tree_size); free(edges);
  free(order_base); free(new_s); free(si); free(xmap); free(x); free(y);
#endif
  
#if USE_HASHING
  if (new_ht) {
    for (i=0; i<=d; i++) {
      dl_forall(Tree, ht[i], ttmp) {
	free(ttmp.branch);
      } dl_endfor;
      dl_free(ht[i]);
    }
  }
#endif
  
  return best_t;
}